

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthPermute(uint *pOut,uint *pIn,int nVars,char *pPerm,int fReturnIn)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint *puVar4;
  int Counter;
  int fChange;
  int Temp;
  int i;
  uint *pTemp;
  int fReturnIn_local;
  char *pPerm_local;
  uint *puStack_18;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  bVar2 = 0;
  puStack_18 = pIn;
  pIn_local = pOut;
  do {
    bVar3 = false;
    for (fChange = 0; puVar4 = puStack_18, fChange < nVars + -1; fChange = fChange + 1) {
      if (pPerm[fChange] == pPerm[fChange + 1]) {
        __assert_fail("pPerm[i] != pPerm[i+1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                      ,0xf1,
                      "void Kit_TruthPermute(unsigned int *, unsigned int *, int, char *, int)");
      }
      if (pPerm[fChange + 1] < pPerm[fChange]) {
        bVar2 = bVar2 + 1;
        bVar3 = true;
        cVar1 = pPerm[fChange];
        pPerm[fChange] = pPerm[fChange + 1];
        pPerm[fChange + 1] = cVar1;
        Kit_TruthSwapAdjacentVars(pIn_local,puStack_18,nVars,fChange);
        puStack_18 = pIn_local;
        pIn_local = puVar4;
      }
    }
  } while (bVar3);
  if (fReturnIn != (uint)((bVar2 ^ 0xff) & 1)) {
    Kit_TruthCopy(pIn_local,puStack_18,nVars);
  }
  return;
}

Assistant:

void Kit_TruthPermute( unsigned * pOut, unsigned * pIn, int nVars, char * pPerm, int fReturnIn )
{
    unsigned * pTemp;
    int i, Temp, fChange, Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            assert( pPerm[i] != pPerm[i+1] );
            if ( pPerm[i] <= pPerm[i+1] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pPerm[i];
            pPerm[i] = pPerm[i+1];
            pPerm[i+1] = Temp;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
}